

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  bool skipheader;
  bool step;
  allocator local_102;
  allocator local_101;
  string local_100;
  string local_e0;
  sigaction sa;
  
  step = false;
  skipheader = false;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar1 = getopt(argc,argv,"vhsoS");
        if (iVar1 == -1) {
          progname = *argv;
          memset(&sa,0,0x98);
          sigemptyset((sigset_t *)&sa.sa_mask);
          sa.__sigaction_handler.sa_handler = segfault_sigaction;
          sa.sa_flags = 4;
          sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
          std::__cxx11::string::string((string *)&local_e0,"",&local_101);
          std::__cxx11::string::string((string *)&local_100,"",&local_102);
          initstreams(&local_e0,&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_e0);
          fmprofiletocsv::doit(skipheader,step);
          return 0;
        }
        if (iVar1 != 0x53) break;
        step = true;
      }
      if (iVar1 != 0x73) break;
      skipheader = true;
    }
    if (iVar1 == 0x68) break;
    if (iVar1 == 0x76) {
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
LAB_0010167d:
      exit(1);
    }
  }
  help();
  goto LAB_0010167d;
}

Assistant:

int main(int argc, char *argv[]) {
    int opt;
    bool skipheader = false;
    bool step = false;
    while ((opt = getopt(argc, argv, "vhsoS")) != -1) {
        switch (opt) {
        case 's':
            skipheader = true;
            break;
        case 'S':
            step = true;
            break;
        case 'v':
            fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
            exit(EXIT_FAILURE);
            break;
        case 'h':
            help();
            exit(EXIT_FAILURE);
        }
    }

    progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
    struct sigaction sa;

    memset(&sa, 0, sizeof(struct sigaction));
    sigemptyset(&sa.sa_mask);
    sa.sa_sigaction = segfault_sigaction;
    sa.sa_flags = SA_SIGINFO;

    sigaction(SIGSEGV, &sa, NULL);
#endif
    try {
        initstreams();        
        fmprofiletocsv::doit(skipheader,step);        
    } catch (std::bad_alloc&) {
        fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
        exit(EXIT_FAILURE);
    }
    return EXIT_SUCCESS;
}